

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O3

void prscode(prscxdef *ctx,int markcomp)

{
  char *pcVar1;
  ushort *puVar2;
  byte *pbVar3;
  ushort *puVar4;
  uchar uVar5;
  ushort uVar6;
  ushort uVar7;
  mcmcxdef *pmVar8;
  toktdef *ptVar9;
  _func_void_toktdef_ptr_char_ptr_int_int_int_int *p_Var10;
  lindef *plVar11;
  emtcxdef *peVar12;
  uint16_t tmp;
  prpnum pVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  char *pcVar19;
  uchar *puVar20;
  size_t sVar21;
  uchar *puVar22;
  toktldef *lcltab;
  uint uVar23;
  ulong uVar24;
  size_t sVar25;
  long lVar26;
  uchar *puVar27;
  uint16_t tmp_1;
  uint uVar28;
  ulong uVar29;
  uchar *puVar30;
  tokdef *ptVar31;
  tokcxdef *ptVar32;
  ulong uVar33;
  tokdef *ptVar34;
  ulong uVar35;
  byte bVar36;
  int varargs;
  byte local_243;
  ushort local_242;
  uint curfr;
  int local_23c;
  uint local_238;
  int local_234;
  ulong local_230;
  toktdef *local_228;
  tokdef tok;
  int parms;
  objnum sc [64];
  
  bVar36 = 0;
  ptVar32 = ctx->prscxtok;
  uVar16 = (ptVar32->tokcxcur).toktyp;
  if ((int)uVar16 < 0x57) {
    if (uVar16 == 1) {
      return;
    }
    if (uVar16 == 0x3e) goto LAB_0011be0b;
LAB_0011beaa:
    if ((uVar16 & 0xfffffffe) == 0xce) {
      uVar14 = toknext(ptVar32);
      uVar23 = uVar16;
    }
    else {
      uVar23 = 0;
      uVar14 = uVar16;
    }
    if (uVar14 == 0x50) {
      uVar14 = toknext(ctx->prscxtok);
      iVar15 = 1;
    }
    else {
      iVar15 = 0;
      if (uVar14 == 0xcd) {
        if ((((char)uVar23 == -0x32) || ((uVar23 & 0xff) == 0)) &&
           (pcVar19 = ctx->prscxspp, pcVar19 != (char *)0x0)) {
          if (uVar23 == 0) {
            errlogf(ctx->prscxerr,"TADS",0x15e);
            pcVar19 = ctx->prscxspp;
          }
          free(pcVar19);
          ctx->prscxspp = (char *)0x0;
          ctx->prscxsps = 0;
          ctx->prscxspf = 0;
        }
        prsspec_defp = &prsspec_defaults;
        uVar24 = 0;
        bVar36 = 0x4f;
        uVar29 = uVar24;
        do {
          local_238 = (uint)uVar29;
          local_243 = bVar36;
          local_230 = uVar24;
          uVar14 = uVar16;
          do {
            if ((int)uVar29 == 0) {
              iVar15 = toknext(ctx->prscxtok);
              if (iVar15 == 0x36) {
                uVar29 = (ulong)(ctx->prscxtok->tokcxcur).tokofs;
                sVar21 = (ulong)*(ushort *)(ctx->prscxpool + uVar29) - 2;
                puVar22 = ctx->prscxpool + uVar29 + 2;
                uVar16 = 0x36;
                goto LAB_0011c0c0;
              }
              if (iVar15 != 0x4d) {
LAB_0011cc1c:
                errsigf(ctx->prscxerr,"TADS",0x157);
              }
              if (uVar23 != 0xcf) {
                errsigf(ctx->prscxerr,"TADS",0x15f);
              }
              uVar16 = toknext(ctx->prscxtok);
              uVar28 = 0;
              break;
            }
            lVar26 = *(long *)(prsspec_defp + 8);
            while( true ) {
              if (lVar26 == 0) goto LAB_0011cc1c;
              uVar16 = uVar14;
              if ((int)*prsspec_defp == (uint)bVar36) break;
              lVar26 = *(long *)(prsspec_defp + 0x18);
              prsspec_defp = prsspec_defp + 0x10;
            }
            do {
              puVar22 = *(uchar **)(prsspec_defp + 8);
              sVar21 = strlen((char *)puVar22);
LAB_0011c0c0:
              puVar20 = (uchar *)ctx->prscxspp;
              if ((puVar20 == (uchar *)0x0) ||
                 (uVar29 = (ulong)ctx->prscxspf, ctx->prscxsps - uVar29 < sVar21 + 2)) {
                uVar29 = (ulong)(uint)((int)sVar21 + 0x80 + (int)ctx->prscxsps);
                puVar20 = mchalo(ctx->prscxerr,uVar29,"prsspec");
                if (ctx->prscxspp != (char *)0x0) {
                  memcpy(puVar20,ctx->prscxspp,ctx->prscxsps);
                  free(ctx->prscxspp);
                }
                ctx->prscxspp = (char *)puVar20;
                ctx->prscxsps = uVar29;
                uVar29 = (ulong)ctx->prscxspf;
              }
              pbVar3 = puVar20 + uVar29;
              *pbVar3 = local_243;
              pbVar3[1] = (byte)sVar21;
              memcpy(pbVar3 + 2,puVar22,sVar21);
              uVar28 = local_238;
              ctx->prscxspf = ctx->prscxspf + (int)sVar21 + 2;
              uVar29 = (ulong)local_238;
              if (local_238 == 0) {
                uVar16 = toknext(ctx->prscxtok);
                break;
              }
              pcVar19 = prsspec_defp + 0x10;
              pcVar1 = prsspec_defp + 0x10;
              prsspec_defp = pcVar19;
            } while ((int)*pcVar1 == (uint)bVar36);
            uVar14 = 7;
          } while (uVar16 == 7);
          if (uVar16 == 0x3e && uVar28 == 0) {
            uVar28 = 1;
          }
          uVar29 = (ulong)uVar28;
          bVar36 = prsspec_wordtypes[local_230 + 1];
          if (((bVar36 != 0) && (uVar28 == 0)) && (uVar16 != 0x3f)) {
            prssigreq(ctx,0x3f);
          }
          uVar24 = local_230 + 1;
        } while (uVar24 != 0xd);
        goto LAB_0011c88f;
      }
    }
    if (uVar14 != 0x38) {
      errsigf(ctx->prscxerr,"TADS",0x12d);
    }
    ptVar31 = &ctx->prscxtok->tokcxcur;
    ptVar34 = &tok;
    for (lVar26 = 0xe; lVar26 != 0; lVar26 = lVar26 + -1) {
      iVar18 = ptVar31->toklen;
      ptVar34->toktyp = ptVar31->toktyp;
      ptVar34->toklen = iVar18;
      ptVar31 = (tokdef *)((long)ptVar31 + (ulong)bVar36 * -0x10 + 8);
      ptVar34 = (tokdef *)((long)ptVar34 + (ulong)bVar36 * -0x10 + 8);
    }
    if (uVar23 == 0xcf) {
      local_234 = markcomp;
      if ((tok.toksym.tokstyp != '\x02') ||
         (ctx->prscxvoc->voccxinh[tok.toksym.toksval >> 8][(byte)tok.toksym.toksval] ==
          (vocidef *)0x0)) {
        errsigf(ctx->prscxerr,"TADS",0x15d);
      }
      pmVar8 = ctx->prscxmem;
      uVar6 = pmVar8->mcmcxgl->mcmcxtab
              [*(byte *)((long)pmVar8->mcmcxmtb[tok.toksym.toksval >> 8] +
                        (ulong)(tok.toksym.toksval & 0xff) * 2 + 1)]
              [(byte)pmVar8->mcmcxmtb[tok.toksym.toksval >> 8][tok.toksym.toksval & 0xff]].mcmosiz;
      puVar22 = mcmalo0(pmVar8,uVar6,(mcmon *)&varargs,0xffff,0);
      puVar20 = mcmlck(ctx->prscxmem,tok.toksym.toksval);
      memcpy(puVar22,puVar20,(ulong)uVar6);
      if ((*(ushort *)(puVar22 + 2) & 1) != 0) {
        iVar15 = 1;
      }
      *(ushort *)(puVar22 + 2) = *(ushort *)(puVar22 + 2) | 5;
      uVar6 = ctx->prscxmem->mcmcxmtb[(ushort)varargs >> 8][varargs & 0xff];
      puVar4 = (ushort *)
               ((long)&ctx->prscxmem->mcmcxgl->mcmcxtab[uVar6 >> 8]->mcmoflg +
               (ulong)((uVar6 & 0xff) << 5));
      *puVar4 = *puVar4 | 1;
      local_23c = iVar15;
      mcmunlck(ctx->prscxmem,tok.toksym.toksval);
      mcmunlck(ctx->prscxmem,(ushort)varargs);
      uVar16 = 0x22;
      if (tok.toksym.tokslen < 0x22) {
        uVar16 = (uint)tok.toksym.tokslen;
      }
      sprintf((char *)&parms,"%.*s@%d",(ulong)uVar16,tok.toksym.toksnam,(ulong)(ushort)varargs);
      ptVar9 = ctx->prscxstab;
      p_Var10 = ptVar9->toktfadd;
      sVar21 = strlen((char *)&parms);
      iVar15 = varargs;
      uVar17 = tokhsh((char *)&parms);
      (*p_Var10)(ptVar9,(char *)&parms,(int)sVar21,2,(int)iVar15,uVar17);
      sc[0] = (ushort)varargs;
      vociren(ctx->prscxvoc,tok.toksym.toksval,(ushort)varargs);
      for (plVar11 = ctx->prscxvoc->voccxrun->runcxdbg->dbgcxlin; plVar11 != (lindef *)0x0;
          plVar11 = plVar11->linnxt) {
        (*plVar11->linrenp)(plVar11,tok.toksym.toksval,(ushort)varargs);
      }
      toknext(ctx->prscxtok);
      iVar18 = 1;
      iVar15 = local_23c;
      markcomp = local_234;
    }
    else {
      prsnreq(ctx,0x34);
      iVar18 = (ctx->prscxtok->tokcxcur).toktyp;
      if (iVar18 < 0x49) {
        if (iVar18 != 0x38) {
          if (iVar18 == 0x46) {
            prsdef(ctx,&tok,8);
            iVar15 = toknext(ctx->prscxtok);
            if (iVar15 != 0x3e) {
              if ((tok.toksym.tokstyp != '\b') &&
                 ((uVar23 != 0xce || (tok.toksym.tokstyp != '\x01')))) {
                errlogf(ctx->prscxerr,"TADS",0x146);
                tok.toksym.tokstyp = '\0';
                (*ctx->prscxstab->toktfset)(ctx->prscxstab,&tok.toksym);
                prsdef(ctx,&tok,8);
              }
              tok.toksym.tokstyp = '\x01';
              (*ctx->prscxstab->toktfset)(ctx->prscxstab,&tok.toksym);
              puVar22 = ctx->prscxplcl;
              local_228 = ctx->prscxtok->tokcxstab;
              local_242 = ctx->prscxslcl;
              varargs = 0;
              parms = 0;
              curfr = 0;
              if (iVar15 == 0x32) {
                lcltab = prsvlst(ctx,(toktldef *)0x0,(prsndef **)0x0,&parms,1,&varargs,0);
                prsreq(ctx,0x33);
              }
              else {
                lcltab = (toktldef *)0x0;
              }
              if (uVar23 == 0xce) {
                for (plVar11 = ctx->prscxvoc->voccxrun->runcxdbg->dbgcxlin; plVar11 != (lindef *)0x0
                    ; plVar11 = plVar11->linnxt) {
                  (*plVar11->lindelp)(plVar11,tok.toksym.toksval);
                }
              }
              puVar20 = mcmlck(ctx->prscxmem,tok.toksym.toksval);
              ctx->prscxemt->emtcxptr = puVar20;
              ctx->prscxemt->emtcxofs = 0;
              ctx->prscxemt->emtcxobj = tok.toksym.toksval;
              uVar6 = (ushort)*(undefined4 *)&ctx->prscxflg;
              ctx->prscxflg = uVar6 | 0x40;
              sc._8_4_ = _setjmp((__jmp_buf_tag *)(sc + 0x38));
              if (sc._8_4_ != 0) {
                ctx->prscxerr->errcxptr = (errdef *)sc._0_8_;
                ctx->prscxplcl = puVar22;
                ctx->prscxslcl = local_242;
                ctx->prscxtok->tokcxstab = local_228;
                ctx->prscxflg = uVar6;
                prsdelgoto(ctx);
                mcmunlck(ctx->prscxmem,tok.toksym.toksval);
                errrse1(ctx->prscxerr,(errdef *)sc);
              }
              sc._0_8_ = ctx->prscxerr->errcxptr;
              ctx->prscxerr->errcxptr = (errdef *)sc;
              if ((ctx->prscxflg & 8) != 0) {
                emtres(ctx->prscxemt,1);
                peVar12 = ctx->prscxemt;
                uVar7 = peVar12->emtcxofs;
                peVar12->emtcxofs = uVar7 + 1;
                peVar12->emtcxptr[uVar7] = 'M';
                emtres(ctx->prscxemt,1);
                peVar12 = ctx->prscxemt;
                uVar7 = peVar12->emtcxofs;
                peVar12->emtcxofs = uVar7 + 1;
                peVar12->emtcxptr[uVar7] = (varargs != 0) * -0x80 + (char)parms;
              }
              if (lcltab != (toktldef *)0x0) {
                prsvgfr(ctx,lcltab,&curfr);
              }
              if ((ctx->prscxtok->tokcxcur).toktyp == 0x3c) {
                prsstm(ctx,0xffff,0xffff,parms,0,0,(prscsdef *)0x0,curfr);
                emtres(ctx->prscxemt,1);
                peVar12 = ctx->prscxemt;
                uVar7 = peVar12->emtcxofs;
                peVar12->emtcxofs = uVar7 + 1;
                peVar12->emtcxptr[uVar7] = '\x16';
                emtres(ctx->prscxemt,2);
                puVar20 = ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs;
                puVar20[0] = '\0';
                puVar20[1] = '\0';
                puVar2 = &ctx->prscxemt->emtcxofs;
                *puVar2 = *puVar2 + 2;
                ctx->prscxplcl = puVar22;
                ctx->prscxslcl = local_242;
                mcmrealo(ctx->prscxmem,tok.toksym.toksval,ctx->prscxemt->emtcxofs);
                pmVar8 = ctx->prscxmem;
                puVar2 = &pmVar8->mcmcxgl->mcmcxtab
                          [*(byte *)((long)pmVar8->mcmcxmtb[tok.toksym.toksval >> 8] +
                                    (ulong)(tok.toksym.toksval & 0xff) * 2 + 1)]
                          [(byte)pmVar8->mcmcxmtb[tok.toksym.toksval >> 8]
                                 [tok.toksym.toksval & 0xff]].mcmoflg;
                *puVar2 = *puVar2 | 1;
                mcmunlck(ctx->prscxmem,tok.toksym.toksval);
                ctx->prscxemt->emtcxptr = (uchar *)0x0;
                ctx->prscxtok->tokcxstab = local_228;
                ctx->prscxflg = uVar6;
                prsdelgoto(ctx);
                ctx->prscxerr->errcxptr = (errdef *)sc._0_8_;
                return;
              }
              prssigreq(ctx,0x3c);
            }
            if (uVar23 != 0) {
              errlogf(ctx->prscxerr,"TADS",0x15c);
            }
            if ((tok.toksym.tokstyp != '\b') && (tok.toksym.tokstyp != '\x01')) {
              errsigf(ctx->prscxerr,"TADS",0x134);
            }
            ptVar32 = ctx->prscxtok;
LAB_0011be0b:
            toknext(ptVar32);
            return;
          }
LAB_0011ccaf:
          errsigf(ctx->prscxerr,"TADS",0x142);
        }
        lVar26 = 0;
        while( true ) {
          prsdef(ctx,&ctx->prscxtok->tokcxcur,7);
          ptVar32 = ctx->prscxtok;
          uVar5 = (ptVar32->tokcxcur).toksym.tokstyp;
          if ((uVar5 != '\x02') && (uVar5 != '\a')) {
            errsigf(ctx->prscxerr,"TADS",0x132);
          }
          sc[lVar26] = (ptVar32->tokcxcur).toksym.toksval;
          iVar18 = toknext(ptVar32);
          if (iVar18 != 0x3f) break;
          toknext(ctx->prscxtok);
          lVar26 = lVar26 + 1;
          if ((int)lVar26 == 0x40) {
            errsigf(ctx->prscxerr,"TADS",0x14b);
          }
        }
        iVar18 = (int)lVar26 + 1;
      }
      else {
        if (iVar18 != 0x49) {
          if (iVar18 == 0x5a) {
            if (uVar23 != 0) {
              errlogf(ctx->prscxerr,"TADS",0x15a);
            }
            prsnreq(ctx,0x46);
            prsreq(ctx,0x3e);
            prsdef(ctx,&tok,10);
            if (tok.toksym.tokstyp == '\n') {
              return;
            }
            errsigf(ctx->prscxerr,"TADS",0x133);
          }
          goto LAB_0011ccaf;
        }
        toknext(ctx->prscxtok);
        iVar18 = 0;
      }
    }
    prsdef(ctx,&tok,7);
    if ((tok.toksym.tokstyp != '\a') && ((uVar23 == 0 || (tok.toksym.tokstyp != '\x02')))) {
      errlogf(ctx->prscxerr,"TADS",0x14c);
      tok.toksym.tokstyp = '\0';
      prsdefobj(ctx,&tok,7);
    }
    if ((uVar23 == 0xce) && (tok.toksym.tokstyp == '\x02')) {
      vocidel(ctx->prscxvoc,tok.toksym.toksval);
      vocdel(ctx->prscxvoc,tok.toksym.toksval);
    }
    tok.toksym.tokstyp = '\x02';
    (*ctx->prscxstab->toktfset)(ctx->prscxstab,&tok.toksym);
    prsobj(ctx,&tok,iVar18,sc,iVar15);
    if (markcomp != 0) {
      objcomp(ctx->prscxmem,tok.toksym.toksval,ctx->prscxflg & 1);
    }
    goto LAB_0011c88f;
  }
  if (uVar16 == 0x57) {
    iVar15 = toknext(ptVar32);
    if (iVar15 != 0x36) {
LAB_0011cc31:
      errsigf(ctx->prscxerr,"TADS",0x153);
    }
    uVar6 = (ctx->prscxtok->tokcxcur).tokofs;
    iVar15 = toknext(ctx->prscxtok);
    if (iVar15 != 0x36) goto LAB_0011cc31;
    uVar7 = (ctx->prscxtok->tokcxcur).tokofs;
    iVar15 = toknext(ctx->prscxtok);
    if (iVar15 != 0x36) goto LAB_0011cc31;
    puVar20 = ctx->prscxpool + uVar6;
    puVar30 = ctx->prscxpool + uVar7;
    uVar6 = (ctx->prscxtok->tokcxcur).tokofs;
    prsnreq(ctx,0x3e);
    uVar16 = (uint)*(ushort *)puVar20;
    uVar14 = (uint)*(ushort *)(ctx->prscxpool + uVar6) + *(ushort *)puVar30 + uVar16;
    puVar22 = (uchar *)ctx->prscxcpp;
    if (puVar22 == (uchar *)0x0) {
      sVar25 = ctx->prscxcps;
    }
    else {
      sVar25 = ctx->prscxcps;
      uVar29 = (ulong)ctx->prscxcpf;
      if ((ulong)uVar14 <= sVar25 - uVar29) goto LAB_0011c366;
    }
    uVar29 = (ulong)((int)sVar25 + uVar14 + 0x100);
    puVar22 = mchalo(ctx->prscxerr,uVar29,"prscmpd");
    if (ctx->prscxcpp != (char *)0x0) {
      memcpy(puVar22,ctx->prscxcpp,ctx->prscxcps);
      free(ctx->prscxcpp);
    }
    ctx->prscxcpp = (char *)puVar22;
    ctx->prscxcps = uVar29;
    uVar29 = (ulong)ctx->prscxcpf;
    uVar16 = (uint)*(ushort *)puVar20;
LAB_0011c366:
    puVar22 = puVar22 + uVar29;
    memcpy(puVar22,puVar20,(ulong)uVar16);
    uVar7 = *(ushort *)puVar20;
    memcpy(puVar22 + uVar7,puVar30,(ulong)*(ushort *)puVar30);
    memcpy(puVar22 + uVar7 + *(ushort *)puVar30,ctx->prscxpool + uVar6,
           (ulong)*(ushort *)(ctx->prscxpool + uVar6));
    ctx->prscxcpf = ctx->prscxcpf + uVar14;
    return;
  }
  if (uVar16 != 0x5b) goto LAB_0011beaa;
  iVar15 = toknext(ptVar32);
  if (iVar15 != 0x36) {
    errsigf(ctx->prscxerr,"TADS",0x154);
  }
  ptVar32 = ctx->prscxtok;
  uVar6 = (ptVar32->tokcxcur).tokofs;
  puVar22 = ctx->prscxpool + uVar6;
  uVar24 = (ulong)*(ushort *)puVar22;
  uVar29 = uVar24 - 2;
  if (uVar24 == 2) {
    uVar24 = 2;
  }
  else {
    puVar20 = ctx->prscxpool + (ulong)uVar6 + 2;
    uVar35 = 0;
    puVar30 = puVar20;
    do {
      uVar33 = (ulong)(*puVar20 == '\\');
      uVar24 = uVar24 - uVar33;
      puVar27 = puVar20 + uVar33;
      puVar20 = puVar27 + 1;
      *puVar30 = *puVar27;
      puVar30 = puVar30 + 1;
      uVar35 = uVar35 + uVar33 + 1;
    } while (uVar35 < uVar29);
    ptVar32 = ctx->prscxtok;
  }
  *(ushort *)puVar22 = (ushort)uVar24;
  toknext(ptVar32);
  pVar13 = prsrqpr(ctx);
  puVar20 = ctx->prscxfsp;
  if (puVar20 == (uchar *)0x0) {
    sVar25 = ctx->prscxfss;
LAB_0011c28f:
    uVar29 = (ulong)((int)uVar24 + (int)sVar25 + 0x100);
    puVar20 = mchalo(ctx->prscxerr,uVar29,"prsfmt");
    if (ctx->prscxfsp != (uchar *)0x0) {
      memcpy(puVar20,ctx->prscxfsp,ctx->prscxfss);
      free(ctx->prscxfsp);
    }
    ctx->prscxfsp = puVar20;
    ctx->prscxfss = uVar29;
    uVar29 = (ulong)ctx->prscxfsf;
  }
  else {
    sVar25 = ctx->prscxfss;
    uVar29 = (ulong)ctx->prscxfsf;
    if (sVar25 - uVar29 < uVar24 + 2) goto LAB_0011c28f;
  }
  *(prpnum *)(puVar20 + uVar29) = pVar13;
  memcpy((prpnum *)((long)(puVar20 + uVar29) + 2),puVar22,uVar24);
  ctx->prscxfsf = ctx->prscxfsf + (int)uVar24 + 2;
LAB_0011c88f:
  prsreq(ctx,0x3e);
  return;
}

Assistant:

void prscode(prscxdef *ctx, int markcomp)
{
    int           t;
    noreg tokdef  tok;
    int           parms;
    uchar        *oldplcl;
    uint          oldslcl;
    int           numsc = 0;           /* number of superclasses for object */
    objnum        sc[PRSMAXSC];           /* superclasses of current object */
    objnum       *scp;
    int           classflg = 0;  /* VOCIFCLASS ==> object is a class object */
    toktdef      *oldltab;
    int           varargs;
    uint          curfr;
    toktldef     *ltab;
    int           oldflg;
    int           modflag = 0;                      /* modify/replace flags */
    
    NOREG((&tok))
    
    t = ctx->prscxtok->tokcxcur.toktyp;
    if (t == TOKTEOF) return;            /* end of file; nothing more to do */
    
    /* allow null statements */
    if (t == TOKTSEM)
    {
        toknext(ctx->prscxtok);
        return;
    }

    /* check for special "compound word" construction */
    if (t == TOKTCOMPOUND)
    {
        prscmpd(ctx);
        return;
    }
    
    /* check for special formatString construct */
    if (t == TOKTFORMAT)
    {
        prsfmt(ctx);
        return;
    }
    
    /* check for 'replace' or 'modify' keywords */
    if (t == TOKTREPLACE || t == TOKTMODIFY)
    {
        modflag = t;
        t = toknext(ctx->prscxtok);
    }

    /* check for specialWords construct */
    if (t == TOKTSPECIAL)
    {
        prsspec(ctx, modflag);
        return;
    }

    /* check for 'class' prefix */
    if (t == TOKTCLASS)
    {
        classflg = VOCIFCLASS;
        t = toknext(ctx->prscxtok);
    }

    if (t != TOKTSYMBOL) errsig(ctx->prscxerr, ERR_REQSYM);
    OSCPYSTRUCT(tok, ctx->prscxtok->tokcxcur);

    /* 'modify <object>' skips the colon and goes directly to the body */
    if (modflag == TOKTMODIFY)
    {
        mcmon   newobj;
        uchar  *newptr;
        uchar  *oldptr;
        char    newnam[TOKNAMMAX+1];
        int     len;
        ushort  objsiz;
        lindef *lin;
        
        /* require a previously defined object */
        if (tok.toksym.tokstyp != TOKSTOBJ
            || vocinh(ctx->prscxvoc, tok.toksym.toksval) == 0)
            errsig(ctx->prscxerr, ERR_MODOBJ);

        /* create a copy of the original object */
        objsiz = mcmobjsiz(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        newptr = mcmalo(ctx->prscxmem, objsiz, &newobj);
        oldptr = mcmlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        memcpy(newptr, oldptr, (size_t)objsiz);

        /* remember whether the original object was a class */
        if (objflg(newptr) & OBJFCLASS)
            classflg = VOCIFCLASS;

        /*
         *   Set the "superseded by modified object" flag in the
         *   original.  Also set the class flag, because we want the
         *   modified version to inherit location and vocabulary. 
         */
        objsflg(newptr, objflg(newptr) | OBJFMOD | OBJFCLASS);
        mcmtch(ctx->prscxmem, (mcmon)newobj);

        /* done with the objects - unlock them */
        mcmunlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        mcmunlck(ctx->prscxmem, newobj);

        /* create a fake symbol table entry for the original data */
        len = tok.toksym.tokslen;
        if (len > TOKNAMMAX - 5) len = TOKNAMMAX - 5;
        sprintf(newnam, "%.*s@%d", len, tok.toksym.toksnam,
                (int)newobj);
        (*ctx->prscxstab->toktfadd)(ctx->prscxstab, newnam,
                                    (int)strlen(newnam), TOKSTOBJ,
                                    (int)newobj, tokhsh(newnam));

        /* the superclass for the new object is simply the old object */
        numsc = 1;
        sc[0] = newobj;

        /* renumber the inheritance records for the old object */
        vociren(ctx->prscxvoc, tok.toksym.toksval, newobj);

        /* go through all line sources and renumber this object */
        for (lin = ctx->prscxvoc->voccxrun->runcxdbg->dbgcxlin ; lin ;
             lin = lin->linnxt)
        {
            /* renumber instances of the object in this line source */
            linrenum(lin, tok.toksym.toksval, newobj);
        }

        /* go parse the object body as normal */
        toknext(ctx->prscxtok);
        goto objbody;
    }
    
    prsnreq(ctx, TOKTCOLON);
    t = ctx->prscxtok->tokcxcur.toktyp;
    switch(t)
    {
    case TOKTEXTERN:
        if (modflag) errlog(ctx->prscxerr, ERR_MODRPLX);
        prsnreq(ctx, TOKTFUNCTION);
        prsreq(ctx, TOKTSEM);
        prsdef(ctx, (tokdef *)&tok, TOKSTEXTERN);
        if (tok.toksym.tokstyp != TOKSTEXTERN)
            errsig(ctx->prscxerr, ERR_REQEXT);
        break;
        
    case TOKTFUNCTION:
        if (modflag == TOKTMODIFY) errlog(ctx->prscxerr, ERR_MODFCN);
        prsdef(ctx, (tokdef *)&tok, TOKSTFWDFN);
        t = toknext(ctx->prscxtok);
        if (t == TOKTSEM)
        {
            if (modflag) errlog(ctx->prscxerr, ERR_MODFWD);
            if (tok.toksym.tokstyp != TOKSTFWDFN &&
                tok.toksym.tokstyp != TOKSTFUNC)
                errsig(ctx->prscxerr, ERR_REQFCN);
            toknext(ctx->prscxtok);
            break;
        }

        /* check that we're not redefining the symbol, then define as fcn */
        if (!(tok.toksym.tokstyp == TOKSTFWDFN
              || (tok.toksym.tokstyp == TOKSTFUNC && modflag == TOKTREPLACE)))
        {
            /* log the error */
            errlog(ctx->prscxerr, ERR_FREDEF);

            /* 
             *   Since the symbol was already defined as something else,
             *   we haven't given it a proper function definition yet.  In
             *   particular, we haven't assigned an object number to the
             *   function.  Do so now by forcing the symbol to undefined
             *   then defining it as a function again.
             *   
             *   Note that we need to force the change in the global
             *   symbol table itself.  This will hose down any previous
             *   definition of the symbol, but this doesn't matter much
             *   since the game is already not playable due to this error.
             */

            /* set it to unknown */
            tok.toksym.tokstyp = TOKSTUNK;

            /* force it back into the global table as unknown */
            (*ctx->prscxstab->toktfset)(ctx->prscxstab,
                                        (toksdef *)&tok.toksym);

            /* define it as a forward function to assign an object ID */
            prsdef(ctx, (tokdef *)&tok, TOKSTFWDFN);
        }

        /* 
         *   make sure the symbol is in the symbol table as a function if
         *   it's not already - it could have been a forward function, in
         *   which case it's time to make it a defined function, since
         *   this is the definition 
         */
        tok.toksym.tokstyp = TOKSTFUNC;
        (*ctx->prscxstab->toktfset)(ctx->prscxstab, (toksdef *)&tok.toksym);
        
        oldltab = ctx->prscxtok->tokcxstab;           /* remember old table */
        oldplcl = ctx->prscxplcl;                /* and old table pool data */
        oldslcl = ctx->prscxslcl;

        varargs = FALSE;
        parms = 0;
        curfr = 0;                                /* no enclosing frame yet */
        ltab = (toktldef *)0;                  /* no local symbol table yet */
        if (t == TOKTLPAR)
        {
            ltab = prsvlst(ctx, (toktldef *)0, (prsndef **)0, &parms, TRUE,
                           &varargs, curfr);
            prsreq(ctx, TOKTRPAR);
        }
        
        /*
         *   If we're replacing this function, delete any references in
         *   line number records to this object; this will prevent the
         *   debugger from attempting to use these records, which will be
         *   invalid after we replace the object's pcode with the new
         *   pcode here.  
         */
        if (modflag == TOKTREPLACE)
        {
            lindef *lin;
            for (lin = ctx->prscxvoc->voccxrun->runcxdbg->dbgcxlin ; lin ;
                 lin = lin->linnxt)
            {
                /* delete instances of the object in this line source */
                lindelnum(lin, (objnum)tok.toksym.toksval);
            }
        }

        /* set up emit context for the new object */
        ctx->prscxemt->emtcxptr = mcmlck(ctx->prscxmem,
                                         (mcmon)tok.toksym.toksval);
        ctx->prscxemt->emtcxofs = 0;
        ctx->prscxemt->emtcxobj = tok.toksym.toksval;

        /* flag that we're doing a function - no "self" */
        oldflg = ctx->prscxflg;
        ctx->prscxflg |= PRSCXFFUNC;
        
        /* now parse the body of the function */
        ERRBEGIN(ctx->prscxerr)
            
        if (ctx->prscxflg & PRSCXFARC)
        {
            emtop(ctx->prscxemt, OPCCHKARGC);
            emtbyte(ctx->prscxemt, (varargs ? 0x80 : 0 ) + parms);
        }
        
        /* if there's a local symbol table, set up debug record */
        if (ltab) prsvgfr(ctx, ltab, &curfr);
        
        if (ctx->prscxtok->tokcxcur.toktyp != TOKTLBRACE)
            prssigreq(ctx, TOKTLBRACE);
        prsstm(ctx, EMTLLNKEND, EMTLLNKEND, parms, 0, 0, (prscsdef *)0,
               curfr);
        
        /* be sure to emit a 'return' at the end of the function */
        emtop(ctx->prscxemt, OPCRETURN);
        emtint2(ctx->prscxemt, 0);
        
        /* restore local symbol table information in context */
        ctx->prscxplcl = oldplcl;
        ctx->prscxslcl = oldslcl;
        
        /* resize the object down to the actual space needed */
        mcmrealo(ctx->prscxmem, (mcmon)tok.toksym.toksval,
                 (ushort)ctx->prscxemt->emtcxofs);
        
        /* tell cache manager the object's been changed, and unlock it */
        mcmtch(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        mcmunlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);

        /* to prevent stray writes to this object... */
        ctx->prscxemt->emtcxptr = (uchar *)0;
        
        /* clean up context changes, and delete labels */
        ctx->prscxtok->tokcxstab = oldltab;
        ctx->prscxflg = oldflg;
        prsdelgoto(ctx);

        ERRCLEAN(ctx->prscxerr)
            ctx->prscxplcl = oldplcl;
            ctx->prscxslcl = oldslcl;
            ctx->prscxtok->tokcxstab = oldltab;
            ctx->prscxflg = oldflg;
            prsdelgoto(ctx);
            mcmunlck(ctx->prscxmem, (mcmon)tok.toksym.toksval);
        ERRENDCLN(ctx->prscxerr)
        
        break;  
        
    case TOKTSYMBOL:
        for (scp = sc ;;)
        {
            int typ;
            
            /* check that we have room for a new superclass */
            if (numsc >= PRSMAXSC) errsig(ctx->prscxerr, ERR_MANYSC);

            /* define superclass symbol as object if not already done */
            prsdef(ctx, &ctx->prscxtok->tokcxcur, TOKSTFWDOBJ);
            typ = ctx->prscxtok->tokcxcur.toksym.tokstyp;
            if (typ != TOKSTOBJ && typ != TOKSTFWDOBJ)
                errsig(ctx->prscxerr, ERR_REQOBJ);
            
            /* add the object to the superclass array */
            *scp++ = ctx->prscxtok->tokcxcur.toksym.toksval;
            ++numsc;
            
            /* skip the token, and keep going as long as the list continues */
            if (toknext(ctx->prscxtok) != TOKTCOMMA) break;
            typ = toknext(ctx->prscxtok);        /* get next object in list */
        }
        goto objbody;
        /* FALLTHROUGH */
        
    case TOKTOBJECT:
        toknext(ctx->prscxtok);
    objbody:
        prsdef(ctx, (tokdef *)&tok, TOKSTFWDOBJ);
        if (!(tok.toksym.tokstyp == TOKSTFWDOBJ
              || (tok.toksym.tokstyp == TOKSTOBJ && modflag != 0)))
        {
            /* 
             *   it's already defined globally as something other than an
             *   object - log an error 
             */
            errlog(ctx->prscxerr, ERR_OREDEF);

            /* 
             *   actually redefine the symbol as an object, so that we can
             *   proceed with the compilation 
             */
            tok.toksym.tokstyp = TOKSTUNK;
            prsdefobj(ctx, (tokdef *)&tok, TOKSTFWDOBJ);
        }

        /* if we're replacing the object, delete its vocabulary records */
        if (modflag == TOKTREPLACE && tok.toksym.tokstyp == TOKSTOBJ)
        {
            vocidel(ctx->prscxvoc, (objnum)tok.toksym.toksval);
            vocdel(ctx->prscxvoc, (objnum)tok.toksym.toksval);
        }

        /* make the symbol refer to an object now */
        tok.toksym.tokstyp = TOKSTOBJ;
        (*ctx->prscxstab->toktfset)(ctx->prscxstab, (toksdef *)&tok.toksym);

        /* compile the object */
        prsobj(ctx, &tok, numsc, sc, classflg);
        if (markcomp)
            objcomp(ctx->prscxmem, (objnum)tok.toksym.toksval,
                    (ctx->prscxflg & PRSCXFLIN) != 0);
        
        prsreq(ctx, TOKTSEM);
        break;
        
    default:
        errsig(ctx->prscxerr, ERR_SYNTAX);
    }
}